

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

_Bool ts_stack_merge(Stack *self,StackVersion version1,StackVersion version2)

{
  StackHead *pSVar1;
  StackNode *pSVar2;
  StackNode *self_00;
  StackLink link;
  _Bool _Var3;
  uint32_t i;
  ulong uVar4;
  long lVar5;
  StackHead *pSVar6;
  
  _Var3 = ts_stack_can_merge(self,version1,version2);
  if (_Var3) {
    pSVar1 = (self->heads).contents;
    pSVar6 = pSVar1 + version1;
    lVar5 = 0x10;
    uVar4 = 0;
    while( true ) {
      pSVar2 = pSVar1[version2].node;
      self_00 = pSVar6->node;
      if (pSVar2->link_count <= uVar4) break;
      link._16_8_ = *(undefined8 *)((long)&pSVar2->links[0].node + lVar5);
      link._0_16_ = *(undefined1 (*) [16])((long)pSVar2->links + lVar5 + -0x10);
      stack_node_add_link(self_00,link,self->subtree_pool);
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x18;
    }
    if (self_00->state == 0) {
      pSVar6->node_count_at_last_error = self_00->node_count;
    }
    ts_stack_remove_version(self,version2);
  }
  return _Var3;
}

Assistant:

bool ts_stack_merge(Stack *self, StackVersion version1, StackVersion version2) {
  if (!ts_stack_can_merge(self, version1, version2)) return false;
  StackHead *head1 = &self->heads.contents[version1];
  StackHead *head2 = &self->heads.contents[version2];
  for (uint32_t i = 0; i < head2->node->link_count; i++) {
    stack_node_add_link(head1->node, head2->node->links[i], self->subtree_pool);
  }
  if (head1->node->state == ERROR_STATE) {
    head1->node_count_at_last_error = head1->node->node_count;
  }
  ts_stack_remove_version(self, version2);
  return true;
}